

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-writer.c
# Opt level: O2

void labpack_writer_begin_map(labpack_writer_t *writer,uint32_t count)

{
  if (writer == (labpack_writer_t *)0x0) {
    __assert_fail("writer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-writer.c"
                  ,0x17a,"void labpack_writer_begin_map(labpack_writer_t *, uint32_t)");
  }
  if (writer->status != LABPACK_STATUS_OK) {
    return;
  }
  mpack_start_map(writer->encoder,count);
  labpack_writer_check_encoder(writer);
  return;
}

Assistant:

void
labpack_writer_begin_map(labpack_writer_t* writer, uint32_t count)
{
    assert(writer);
    if (labpack_writer_is_ok(writer)) {
        mpack_start_map(writer->encoder, count);
        labpack_writer_check_encoder(writer);
    }
}